

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O2

Var create_const_vector(Context *ctx,ConstVector *consts)

{
  Var pvVar1;
  Var obj;
  const_reference pvVar2;
  char *pcVar3;
  ulong __n;
  char local_78 [8];
  char buf [32];
  
  pvVar1 = (*ctx->chakra->spec->createArray)(ctx->chakra->user_data);
  __n = 0;
  do {
    if ((ulong)(((long)(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>).
                      _M_impl.super__Vector_impl_data._M_start) / 0x38) <= __n) {
      return pvVar1;
    }
    obj = (*ctx->chakra->spec->createObject)(ctx->chakra->user_data);
    (*ctx->chakra->spec->push)(pvVar1,obj,ctx->chakra->user_data);
    pvVar2 = std::vector<wabt::Const,_std::allocator<wabt::Const>_>::at(consts,__n);
    switch(pvVar2->type) {
    case F64:
      pcVar3 = "f64";
      break;
    case F32:
      pcVar3 = "f32";
      goto LAB_00d76839;
    case I64:
      pcVar3 = "i64";
      break;
    case I32:
      pcVar3 = "i32";
LAB_00d76839:
      write_string(ctx,obj,0xb,pcVar3,0xffffffff);
      snprintf(local_78,0x20,"%u",(ulong)(pvVar2->field_2).u32);
      goto LAB_00d76857;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/chakra/wabtapi.cc"
                    ,200,"Js::Var create_const_vector(Context *, const ConstVector &)");
    }
    write_string(ctx,obj,0xb,pcVar3,0xffffffff);
    snprintf(local_78,0x20,"%llu",(pvVar2->field_2).u64);
LAB_00d76857:
    write_string(ctx,obj,0xc,local_78,0xffffffff);
    __n = __n + 1;
  } while( true );
}

Assistant:

Js::Var create_const_vector(Context* ctx, const ConstVector& consts)
{
    Js::Var constsArr = ctx->chakra->spec->createArray(ctx->chakra->user_data);

    size_t i;
    for (i = 0; i < consts.size(); ++i)
    {
        Js::Var constDescriptor = ctx->chakra->spec->createObject(ctx->chakra->user_data);
        ctx->chakra->spec->push(constsArr, constDescriptor, ctx->chakra->user_data);

        char buf[32];
        const Const& const_ = consts.at(i);
        switch (const_.type)
        {
        case Type::I32:
            write_string(ctx, constDescriptor, PropertyIds::type, "i32");
            wabt_snprintf(buf, 32, "%u", const_.u32);
            break;
        case Type::I64:
            write_string(ctx, constDescriptor, PropertyIds::type, "i64");
            wabt_snprintf(buf, 32, "%llu", const_.u64);
            break;
        case Type::F32:
            write_string(ctx, constDescriptor, PropertyIds::type, "f32");
            wabt_snprintf(buf, 32, "%u", const_.f32_bits);
            break;
        case Type::F64:
            write_string(ctx, constDescriptor, PropertyIds::type, "f64");
            wabt_snprintf(buf, 32, "%llu", const_.f64_bits);
            break;
        default:
            assert(0);
            throw WabtAPIError("invalid constant type");
        }
        write_string(ctx, constDescriptor, PropertyIds::value, buf);
    }
    return constsArr;
}